

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int compare_files(char *original,char *generated)

{
  uint uVar1;
  undefined8 in_RAX;
  FILE *__stream;
  FILE *__stream_00;
  long lVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  char ch2;
  char ch1;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  log_info("compare_files","%-40s %s\n",original,generated);
  __stream = (FILE *)bin_open_read(original);
  __stream_00 = (FILE *)bin_open_read(generated);
  fseek(__stream,0,2);
  lVar2 = ftell(__stream);
  rewind(__stream);
  fseek(__stream_00,0,2);
  lVar3 = ftell(__stream_00);
  rewind(__stream_00);
  if (lVar2 == lVar3) {
    bVar4 = 0 < lVar2;
    if (0 < lVar2) {
      fread((void *)((long)&uStack_38 + 7),1,1,__stream);
      fread((void *)((long)&uStack_38 + 6),1,1,__stream_00);
      uVar5 = 0;
      if (uStack_38._7_1_ == uStack_38._6_1_) {
        uVar5 = 0;
        do {
          if (lVar2 - 1U == uVar5) {
            bVar4 = false;
            goto LAB_001016d9;
          }
          fread((void *)((long)&uStack_38 + 7),1,1,__stream);
          fread((void *)((long)&uStack_38 + 6),1,1,__stream_00);
          uVar5 = uVar5 + 1;
        } while (uStack_38._7_1_ == uStack_38._6_1_);
        bVar4 = (long)uVar5 < lVar2;
      }
      log_error("compare_files",
                "different byte found at position (%x). original 0x%02X != generated 0x%02X\n",
                uVar5 & 0xffffffff,(ulong)(uint)(int)uStack_38._7_1_,
                (ulong)(uint)(int)uStack_38._6_1_);
    }
LAB_001016d9:
    uVar1 = (uint)bVar4;
  }
  else {
    log_error("compare_files","different file size:  %s (%ld byte) != %s (%ld byte)\n",original,
              lVar2,generated,lVar3);
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int compare_files(const char *original, const char *generated) {
    log_info("compare_files", "%-40s %s\n", original, generated);

    FILE* fp_original = bin_open_read(original);
    FILE* fp_generated = bin_open_read(generated);

    // obtain file size:
    fseek (fp_original, 0, SEEK_END);

    long sz_original = ftell (fp_original);
    rewind (fp_original);

    // obtain file size:
    fseek (fp_generated, 0, SEEK_END);
    long sz_generated = ftell (fp_generated);
    rewind (fp_generated);

    if (sz_original != sz_generated) {
        log_error("compare_files", "different file size:  %s (%ld byte) != %s (%ld byte)\n", original, sz_original, generated, sz_generated);
        return RC_FAIL;
    }

    char ch1, ch2;
    for (int i=0; i<sz_original; i++) {
        fread(&ch1, 1, 1, fp_original);
        fread(&ch2, 1, 1, fp_generated);
        if (ch1 != ch2) {
            log_error("compare_files", "different byte found at position (%x). original 0x%02X != generated 0x%02X\n", i , ch1, ch2);
            return RC_FAIL;
        }
    }
    return RC_OK;
}